

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofAngle2.cpp
# Opt level: O1

void __thiscall
OpenMD::GofAngle2::GofAngle2
          (GofAngle2 *this,SimInfo *info,string *filename,string *sele1,string *sele2,int nangleBins
          )

{
  uint uVar1;
  long *plVar2;
  ostream *poVar3;
  size_type __new_size;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  string paramString;
  stringstream params;
  string local_1e8;
  SelectionEvaluator *local_1c8;
  SelectionManager *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ios_base local_138 [264];
  
  RadialDistrFunc::RadialDistrFunc
            (&this->super_RadialDistrFunc,info,filename,sele1,sele2,nangleBins);
  (this->super_RadialDistrFunc).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__GofAngle2_00339dc0;
  this->doSele3_ = false;
  SelectionManager::SelectionManager(&this->seleMan3_,info);
  local_1c8 = &this->evaluator3_;
  local_1c0 = &this->seleMan3_;
  SelectionEvaluator::SelectionEvaluator(local_1c8,info);
  (this->selectionScript3_)._M_dataplus._M_p = (pointer)&(this->selectionScript3_).field_2;
  (this->selectionScript3_)._M_string_length = 0;
  (this->selectionScript3_).field_2._M_local_buf[0] = '\0';
  (this->histogram_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->avgGofr_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->avgGofr_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->avgGofr_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"Radial Distribution Function","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.analysisType_);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  getPrefix(&local_1e8,filename);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1a8 = *plVar4;
    lStack_1a0 = plVar2[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar4;
    local_1b8 = (long *)*plVar2;
  }
  local_1b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  this->deltaCosAngle_ = 2.0 / (double)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," nAngleBins = ",0xe);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", deltaCosAngle = ",0x12);
  std::ostream::_M_insert<double>(this->deltaCosAngle_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.paramString_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->histogram_,(ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->avgGofr_,(ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_);
  uVar1 = (this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  __new_size = (size_type)uVar1;
  if (uVar1 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((this->histogram_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar5),__new_size);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((this->avgGofr_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar5),
                 (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_);
      uVar6 = uVar6 + 1;
      __new_size = (size_type)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
      lVar5 = lVar5 + 0x18;
    } while (uVar6 < __new_size);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

GofAngle2::GofAngle2(SimInfo* info, const std::string& filename,
                       const std::string& sele1, const std::string& sele2,
                       int nangleBins) :
      RadialDistrFunc(info, filename, sele1, sele2, nangleBins),
      doSele3_(false), seleMan3_(info), evaluator3_(info) {
    setAnalysisType("Radial Distribution Function");
    setOutputName(getPrefix(filename) + ".gto");

    deltaCosAngle_ = 2.0 / nBins_;

    std::stringstream params;
    params << " nAngleBins = " << nBins_
           << ", deltaCosAngle = " << deltaCosAngle_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    histogram_.resize(nBins_);
    avgGofr_.resize(nBins_);
    for (unsigned int i = 0; i < nBins_; ++i) {
      histogram_[i].resize(nBins_);
      avgGofr_[i].resize(nBins_);
    }
  }